

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O2

QList<QtGraphicsAnchorLayout::AnchorData_*> *
getVariables(QList<QtGraphicsAnchorLayout::AnchorData_*> *__return_storage_ptr__,
            QList<QSimplexConstraint_*> *constraints)

{
  Span *pSVar1;
  long lVar2;
  ulong uVar3;
  int i;
  ulong uVar4;
  long in_FS_OFFSET;
  QSet<QtGraphicsAnchorLayout::AnchorData_*> local_70 [2];
  long local_60;
  piter local_58;
  QHash<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40.d = (Data *)0x0;
  for (uVar4 = 0; uVar4 < (ulong)(constraints->d).size; uVar4 = uVar4 + 1) {
    local_58.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data<QHashPrivate::Node<QSimplexVariable_*,_double>_> *)&DAT_aaaaaaaaaaaaaaaa;
    local_58 = (piter)QHash<QSimplexVariable_*,_double>::cbegin
                                (&(constraints->d).ptr[uVar4]->variables);
    while( true ) {
      if (local_58.d == (Data<QHashPrivate::Node<QSimplexVariable_*,_double>_> *)0x0 &&
          local_58.bucket == 0) break;
      pSVar1 = (local_58.d)->spans;
      uVar3 = local_58.bucket >> 7;
      lVar2 = *(long *)pSVar1[uVar3].entries[pSVar1[uVar3].offsets[(uint)local_58.bucket & 0x7f]].
                       storage.data;
      local_60 = lVar2 + -8;
      if (lVar2 == 0) {
        local_60 = 0;
      }
      QSet<QtGraphicsAnchorLayout::AnchorData_*>::insert(local_70,(AnchorData **)&local_40);
      QHashPrivate::iterator<QHashPrivate::Node<QSimplexVariable_*,_double>_>::operator++(&local_58)
      ;
    }
  }
  QSet<QtGraphicsAnchorLayout::AnchorData_*>::values
            (__return_storage_ptr__,(QSet<QtGraphicsAnchorLayout::AnchorData_*> *)&local_40);
  QHash<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue>::~QHash(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<AnchorData *> getVariables(const QList<QSimplexConstraint *> &constraints)
{
    QSet<AnchorData *> variableSet;
    for (int i = 0; i < constraints.size(); ++i) {
        const QSimplexConstraint *c = constraints.at(i);
        for (auto it = c->variables.cbegin(), end = c->variables.cend(); it != end; ++it)
            variableSet.insert(static_cast<AnchorData *>(it.key()));
    }
    return variableSet.values();
}